

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::
emplace_back<slang::ast::ForeachLoopStatement::LoopDim>
          (SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim> *this,LoopDim *args)

{
  undefined8 uVar1;
  pointer pLVar2;
  reference pLVar3;
  
  pLVar2 = this->data_ + this->len;
  if (this->len == this->cap) {
    pLVar2 = emplaceRealloc<slang::ast::ForeachLoopStatement::LoopDim>(this,pLVar2,args);
    return pLVar2;
  }
  pLVar2->loopVar = args->loopVar;
  uVar1 = *(undefined8 *)
           &(args->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
            super__Optional_payload_base<slang::ConstantRange>._M_engaged;
  (pLVar2->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
  super__Optional_payload_base<slang::ConstantRange>._M_payload =
       (args->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
       super__Optional_payload_base<slang::ConstantRange>._M_payload;
  *(undefined8 *)
   &(pLVar2->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
    super__Optional_payload_base<slang::ConstantRange>._M_engaged = uVar1;
  this->len = this->len + 1;
  pLVar3 = back(this);
  return pLVar3;
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }